

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::ConsoleReporter::printTotals(ConsoleReporter *this,Totals *totals)

{
  bool bVar1;
  size_t sVar2;
  ostream *poVar3;
  ostream *poVar4;
  allocator<char> local_4d1;
  string local_4d0;
  allocator<char> local_4a9;
  string local_4a8;
  allocator<char> local_481;
  string local_480;
  SummaryColumn local_460;
  SummaryColumn local_420;
  SummaryColumn local_3e0;
  allocator<char> local_399;
  string local_398;
  SummaryColumn local_378;
  SummaryColumn local_338;
  SummaryColumn local_2f8;
  allocator<char> local_2b1;
  string local_2b0;
  SummaryColumn local_290;
  SummaryColumn local_250;
  SummaryColumn local_210;
  allocator<char> local_1c9;
  string local_1c8;
  SummaryColumn local_1a8;
  SummaryColumn local_168;
  SummaryColumn local_128;
  undefined1 local_e8 [8];
  vector<Catch::SummaryColumn,_std::allocator<Catch::SummaryColumn>_> columns;
  string local_c8;
  pluralise local_a8;
  allocator<char> local_79;
  string local_78;
  pluralise local_58;
  Colour local_2d [20];
  Colour local_19;
  Totals *local_18;
  Totals *totals_local;
  ConsoleReporter *this_local;
  
  local_18 = totals;
  totals_local = (Totals *)this;
  sVar2 = Counts::total(&totals->testCases);
  if (sVar2 == 0) {
    poVar3 = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
    Colour::Colour(&local_19,BrightYellow);
    poVar3 = Catch::operator<<(poVar3,&local_19);
    std::operator<<((ostream *)poVar3,"No tests ran\n");
    Colour::~Colour(&local_19);
  }
  else {
    sVar2 = Counts::total(&local_18->assertions);
    if ((sVar2 == 0) || (bVar1 = Counts::allPassed(&local_18->testCases), !bVar1)) {
      clara::std::vector<Catch::SummaryColumn,_std::allocator<Catch::SummaryColumn>_>::vector
                ((vector<Catch::SummaryColumn,_std::allocator<Catch::SummaryColumn>_> *)local_e8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c8,"",&local_1c9);
      SummaryColumn::SummaryColumn(&local_1a8,&local_1c8,None);
      sVar2 = Counts::total(&local_18->testCases);
      SummaryColumn::addRow(&local_168,&local_1a8,sVar2);
      sVar2 = Counts::total(&local_18->assertions);
      SummaryColumn::addRow(&local_128,&local_168,sVar2);
      clara::std::vector<Catch::SummaryColumn,_std::allocator<Catch::SummaryColumn>_>::push_back
                ((vector<Catch::SummaryColumn,_std::allocator<Catch::SummaryColumn>_> *)local_e8,
                 &local_128);
      SummaryColumn::~SummaryColumn(&local_128);
      SummaryColumn::~SummaryColumn(&local_168);
      SummaryColumn::~SummaryColumn(&local_1a8);
      std::__cxx11::string::~string((string *)&local_1c8);
      std::allocator<char>::~allocator((allocator<char> *)&local_1c9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_2b0,"passed",&local_2b1);
      SummaryColumn::SummaryColumn(&local_290,&local_2b0,Green);
      SummaryColumn::addRow(&local_250,&local_290,(local_18->testCases).passed);
      SummaryColumn::addRow(&local_210,&local_250,(local_18->assertions).passed);
      clara::std::vector<Catch::SummaryColumn,_std::allocator<Catch::SummaryColumn>_>::push_back
                ((vector<Catch::SummaryColumn,_std::allocator<Catch::SummaryColumn>_> *)local_e8,
                 &local_210);
      SummaryColumn::~SummaryColumn(&local_210);
      SummaryColumn::~SummaryColumn(&local_250);
      SummaryColumn::~SummaryColumn(&local_290);
      std::__cxx11::string::~string((string *)&local_2b0);
      std::allocator<char>::~allocator((allocator<char> *)&local_2b1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_398,"failed",&local_399);
      SummaryColumn::SummaryColumn(&local_378,&local_398,BrightRed);
      SummaryColumn::addRow(&local_338,&local_378,(local_18->testCases).failed);
      SummaryColumn::addRow(&local_2f8,&local_338,(local_18->assertions).failed);
      clara::std::vector<Catch::SummaryColumn,_std::allocator<Catch::SummaryColumn>_>::push_back
                ((vector<Catch::SummaryColumn,_std::allocator<Catch::SummaryColumn>_> *)local_e8,
                 &local_2f8);
      SummaryColumn::~SummaryColumn(&local_2f8);
      SummaryColumn::~SummaryColumn(&local_338);
      SummaryColumn::~SummaryColumn(&local_378);
      std::__cxx11::string::~string((string *)&local_398);
      std::allocator<char>::~allocator((allocator<char> *)&local_399);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_480,"failed as expected",&local_481);
      SummaryColumn::SummaryColumn(&local_460,&local_480,BrightYellow);
      SummaryColumn::addRow(&local_420,&local_460,(local_18->testCases).failedButOk);
      SummaryColumn::addRow(&local_3e0,&local_420,(local_18->assertions).failedButOk);
      clara::std::vector<Catch::SummaryColumn,_std::allocator<Catch::SummaryColumn>_>::push_back
                ((vector<Catch::SummaryColumn,_std::allocator<Catch::SummaryColumn>_> *)local_e8,
                 &local_3e0);
      SummaryColumn::~SummaryColumn(&local_3e0);
      SummaryColumn::~SummaryColumn(&local_420);
      SummaryColumn::~SummaryColumn(&local_460);
      std::__cxx11::string::~string((string *)&local_480);
      std::allocator<char>::~allocator((allocator<char> *)&local_481);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4a8,"test cases",&local_4a9);
      printSummaryRow(this,&local_4a8,
                      (vector<Catch::SummaryColumn,_std::allocator<Catch::SummaryColumn>_> *)
                      local_e8,0);
      std::__cxx11::string::~string((string *)&local_4a8);
      std::allocator<char>::~allocator((allocator<char> *)&local_4a9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4d0,"assertions",&local_4d1);
      printSummaryRow(this,&local_4d0,
                      (vector<Catch::SummaryColumn,_std::allocator<Catch::SummaryColumn>_> *)
                      local_e8,1);
      std::__cxx11::string::~string((string *)&local_4d0);
      std::allocator<char>::~allocator((allocator<char> *)&local_4d1);
      clara::std::vector<Catch::SummaryColumn,_std::allocator<Catch::SummaryColumn>_>::~vector
                ((vector<Catch::SummaryColumn,_std::allocator<Catch::SummaryColumn>_> *)local_e8);
    }
    else {
      poVar3 = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
      Colour::Colour(local_2d,BrightGreen);
      poVar3 = Catch::operator<<(poVar3,local_2d);
      std::operator<<((ostream *)poVar3,"All tests passed");
      Colour::~Colour(local_2d);
      poVar4 = std::operator<<((ostream *)
                               (this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream,
                               " (");
      sVar2 = (local_18->assertions).passed;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"assertion",&local_79);
      pluralise::pluralise(&local_58,sVar2,&local_78);
      poVar3 = Catch::operator<<((ostream *)poVar4,&local_58);
      poVar4 = std::operator<<((ostream *)poVar3," in ");
      sVar2 = (local_18->testCases).passed;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c8,"test case",
                 (allocator<char> *)
                 ((long)&columns.
                         super__Vector_base<Catch::SummaryColumn,_std::allocator<Catch::SummaryColumn>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      pluralise::pluralise(&local_a8,sVar2,&local_c8);
      poVar3 = Catch::operator<<((ostream *)poVar4,&local_a8);
      poVar4 = std::operator<<((ostream *)poVar3,')');
      std::operator<<(poVar4,'\n');
      pluralise::~pluralise(&local_a8);
      std::__cxx11::string::~string((string *)&local_c8);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&columns.
                         super__Vector_base<Catch::SummaryColumn,_std::allocator<Catch::SummaryColumn>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      pluralise::~pluralise(&local_58);
      std::__cxx11::string::~string((string *)&local_78);
      std::allocator<char>::~allocator((allocator<char> *)&local_79);
    }
  }
  return;
}

Assistant:

void ConsoleReporter::printTotals( Totals const& totals ) {
    if (totals.testCases.total() == 0) {
        stream << Colour(Colour::Warning) << "No tests ran\n";
    } else if (totals.assertions.total() > 0 && totals.testCases.allPassed()) {
        stream << Colour(Colour::ResultSuccess) << "All tests passed";
        stream << " ("
            << pluralise(totals.assertions.passed, "assertion") << " in "
            << pluralise(totals.testCases.passed, "test case") << ')'
            << '\n';
    } else {

        std::vector<SummaryColumn> columns;
        columns.push_back(SummaryColumn("", Colour::None)
                          .addRow(totals.testCases.total())
                          .addRow(totals.assertions.total()));
        columns.push_back(SummaryColumn("passed", Colour::Success)
                          .addRow(totals.testCases.passed)
                          .addRow(totals.assertions.passed));
        columns.push_back(SummaryColumn("failed", Colour::ResultError)
                          .addRow(totals.testCases.failed)
                          .addRow(totals.assertions.failed));
        columns.push_back(SummaryColumn("failed as expected", Colour::ResultExpectedFailure)
                          .addRow(totals.testCases.failedButOk)
                          .addRow(totals.assertions.failedButOk));

        printSummaryRow("test cases", columns, 0);
        printSummaryRow("assertions", columns, 1);
    }
}